

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O2

double google::protobuf::io::NoLocaleStrtod(char *text,char **original_endptr)

{
  _Alloc_hider _Var1;
  int iVar2;
  LogMessage *pLVar3;
  size_t sVar4;
  LogFinisher local_91;
  string localized;
  char cStack_59;
  char *localized_endptr;
  double local_40;
  char *temp_endptr;
  
  local_40 = strtod(text,&temp_endptr);
  if (original_endptr != (char **)0x0) {
    *original_endptr = temp_endptr;
  }
  if (*temp_endptr == '.') {
    iVar2 = sprintf((char *)&localized_endptr,"%.1f",0x3ff8000000000000);
    if ((char)localized_endptr != '1') {
      internal::LogMessage::LogMessage
                ((LogMessage *)&localized,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/strtod.cc"
                 ,0x3f);
      pLVar3 = internal::LogMessage::operator<<
                         ((LogMessage *)&localized,"CHECK failed: (temp[0]) == (\'1\'): ");
      internal::LogFinisher::operator=(&local_91,pLVar3);
      internal::LogMessage::~LogMessage((LogMessage *)&localized);
    }
    if (*(char *)((long)iVar2 + -1 + (long)&localized_endptr) != '5') {
      internal::LogMessage::LogMessage
                ((LogMessage *)&localized,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/strtod.cc"
                 ,0x40);
      pLVar3 = internal::LogMessage::operator<<
                         ((LogMessage *)&localized,"CHECK failed: (temp[size-1]) == (\'5\'): ");
      internal::LogFinisher::operator=(&local_91,pLVar3);
      internal::LogMessage::~LogMessage((LogMessage *)&localized);
    }
    if (6 < iVar2) {
      internal::LogMessage::LogMessage
                ((LogMessage *)&localized,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/strtod.cc"
                 ,0x41);
      pLVar3 = internal::LogMessage::operator<<
                         ((LogMessage *)&localized,"CHECK failed: (size) <= (6): ");
      internal::LogFinisher::operator=(&local_91,pLVar3);
      internal::LogMessage::~LogMessage((LogMessage *)&localized);
    }
    localized._M_dataplus._M_p = (pointer)&localized.field_2;
    localized._M_string_length = 0;
    localized.field_2._M_local_buf[0] = '\0';
    strlen(text);
    std::__cxx11::string::reserve((ulong)&localized);
    std::__cxx11::string::append<char_const*,void>((string *)&localized,text,temp_endptr);
    std::__cxx11::string::append((char *)&localized,(long)&localized_endptr + 1);
    std::__cxx11::string::append((char *)&localized);
    _Var1 = localized._M_dataplus;
    local_40 = strtod(localized._M_dataplus._M_p,&localized_endptr);
    if ((original_endptr != (char **)0x0) &&
       ((long)temp_endptr - (long)text <
        CONCAT71(localized_endptr._1_7_,(char)localized_endptr) - (long)_Var1._M_p)) {
      iVar2 = (int)localized._M_string_length;
      sVar4 = strlen(text);
      *original_endptr =
           text + (CONCAT71(localized_endptr._1_7_,(char)localized_endptr) -
                  (long)(_Var1._M_p + (iVar2 - (int)sVar4)));
    }
    std::__cxx11::string::~string((string *)&localized);
  }
  return local_40;
}

Assistant:

double NoLocaleStrtod(const char* text, char** original_endptr) {
  // We cannot simply set the locale to "C" temporarily with setlocale()
  // as this is not thread-safe.  Instead, we try to parse in the current
  // locale first.  If parsing stops at a '.' character, then this is a
  // pretty good hint that we're actually in some other locale in which
  // '.' is not the radix character.

  char* temp_endptr;
  double result = strtod(text, &temp_endptr);
  if (original_endptr != NULL) *original_endptr = temp_endptr;
  if (*temp_endptr != '.') return result;

  // Parsing halted on a '.'.  Perhaps we're in a different locale?  Let's
  // try to replace the '.' with a locale-specific radix character and
  // try again.
  string localized = LocalizeRadix(text, temp_endptr);
  const char* localized_cstr = localized.c_str();
  char* localized_endptr;
  result = strtod(localized_cstr, &localized_endptr);
  if ((localized_endptr - localized_cstr) >
      (temp_endptr - text)) {
    // This attempt got further, so replacing the decimal must have helped.
    // Update original_endptr to point at the right location.
    if (original_endptr != NULL) {
      // size_diff is non-zero if the localized radix has multiple bytes.
      int size_diff = localized.size() - strlen(text);
      // const_cast is necessary to match the strtod() interface.
      *original_endptr = const_cast<char*>(
        text + (localized_endptr - localized_cstr - size_diff));
    }
  }

  return result;
}